

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double * __thiscall ON_3dPoint::operator[](ON_3dPoint *this,uint i)

{
  long lVar1;
  
  lVar1 = 0;
  if (i != 0) {
    lVar1 = (ulong)(1 < i) * 8 + 8;
  }
  return (double *)((long)&this->x + lVar1);
}

Assistant:

double& ON_3dPoint::operator[](unsigned int i)
{
  double* pd = (i<=0)? &x : ( (i>=2) ?  &z : &y);
  return *pd;
}